

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O0

int __thiscall cppcms::util::stackbuf<128UL>::overflow(stackbuf<128UL> *this,int c)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 uVar3;
  bad_alloc *this_00;
  long lVar4;
  int in_ESI;
  char *in_RDI;
  char *new_ptr;
  size_t new_size;
  size_t current_size;
  bad_alloc *in_stack_ffffffffffffffc0;
  
  pcVar1 = (char *)std::streambuf::pbase();
  if (pcVar1 == in_RDI + 0x48) {
    pvVar2 = malloc(0x101);
    *(void **)(in_RDI + 0x40) = pvVar2;
    if (*(long *)(in_RDI + 0x40) == 0) {
      uVar3 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffffc0);
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(*(void **)(in_RDI + 0x40),in_RDI + 0x48,0x80);
  }
  else {
    this_00 = (bad_alloc *)std::streambuf::pptr();
    lVar4 = std::streambuf::pbase();
    pvVar2 = realloc(*(void **)(in_RDI + 0x40),((long)this_00 - lVar4) * 2 + 1);
    if (pvVar2 == (void *)0x0) {
      uVar3 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(in_RDI + 0x40) = pvVar2;
  }
  std::streambuf::setp(in_RDI,*(char **)(in_RDI + 0x40));
  std::streambuf::pbump((int)in_RDI);
  if (in_ESI != -1) {
    std::streambuf::sputc((char)in_RDI);
  }
  return 0;
}

Assistant:

int overflow(int c)
		{
			size_t current_size;
			size_t new_size;
			if(pbase() == on_stack_) {
				current_size = OnStackSize;
				new_size = OnStackSize * 2;
				on_heap_ = (char *)malloc(new_size + 1);
				if(!on_heap_)
					throw std::bad_alloc();
				memcpy(on_heap_,on_stack_,current_size);
			}
			else {
				current_size = pptr() - pbase();
				new_size = current_size * 2;
				char *new_ptr = (char *)realloc(on_heap_,new_size + 1);
				if(!new_ptr)
					throw std::bad_alloc();
				on_heap_ = new_ptr;

			}
			setp(on_heap_,on_heap_ + new_size);
			pbump(current_size);
			if(c!=EOF)
				sputc(c);
			return 0;
		}